

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataReader::MetadataReader
          (MetadataReader *this,MetadataManager *manager,MetaBlockPointer pointer,
          optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> read_pointers_p,
          BlockReaderType type)

{
  MetadataPointer MVar1;
  vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *this_00;
  undefined8 extraout_RDX;
  MetaBlockPointer pointer_00;
  value_type local_38;
  
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&PTR_ReadData_01784870;
  this->manager = manager;
  this->type = type;
  local_38.block_pointer = pointer.block_pointer;
  local_38._8_8_ = pointer._8_8_;
  BufferHandle::BufferHandle(&(this->block).handle);
  pointer_00.offset = (int)extraout_RDX;
  pointer_00.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
  pointer_00.block_pointer = pointer.block_pointer;
  MVar1 = FromDiskPointer(this,pointer_00);
  this->next_pointer = MVar1;
  this->has_next_block = true;
  (this->read_pointers).ptr = read_pointers_p.ptr;
  this->index = 0;
  this->offset = 0;
  this->next_offset = pointer._8_8_ & 0xffffffff;
  this->capacity = 0;
  if (read_pointers_p.ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
    this_00 = &optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::operator->
                         (&this->read_pointers)->
               super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::push_back
              (this_00,&local_38);
  }
  return;
}

Assistant:

MetadataReader::MetadataReader(MetadataManager &manager, MetaBlockPointer pointer,
                               optional_ptr<vector<MetaBlockPointer>> read_pointers_p, BlockReaderType type)
    : manager(manager), type(type), next_pointer(FromDiskPointer(pointer)), has_next_block(true),
      read_pointers(read_pointers_p), index(0), offset(0), next_offset(pointer.offset), capacity(0) {
	if (read_pointers) {
		D_ASSERT(read_pointers->empty());
		read_pointers->push_back(pointer);
	}
}